

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_ConstrainInit(void)

{
  Vec_Ptr_t *vNodes_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 *__s;
  InitConstraint_t *pConstraint;
  Abc_Obj_t *pOrigObj;
  Abc_Obj_t *pObj;
  int lag;
  int n;
  int i;
  int mid;
  int high;
  int low;
  Vec_Ptr_t *vNodes;
  
  pOrigObj = (Abc_Obj_t *)0x0;
  __s = (undefined8 *)malloc(0x28);
  memset(__s,0,0x28);
  if (pManMR->pInitNtk == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x408,"void Abc_FlowRetime_ConstrainInit()");
  }
  if (pManMR->fVerbose != 0) {
    printf("\tsearch for initial state conflict...\n");
  }
  _high = Abc_NtkDfs(pManMR->pInitNtk,0);
  pObj._4_4_ = Vec_PtrSize(_high);
  for (lag = 0; iVar2 = lag, iVar1 = Abc_NtkPiNum(pManMR->pInitNtk), iVar2 < iVar1; lag = lag + 1) {
    pOrigObj = Abc_NtkPi(pManMR->pInitNtk,lag);
    Vec_PtrPush(_high,pOrigObj);
  }
  Vec_PtrReorder(_high,pObj._4_4_);
  iVar2 = Abc_FlowRetime_PartialSat(_high,0);
  if (iVar2 == 0) {
    while( true ) {
      if (pManMR->fVerbose != 0) {
        printf("\t\t");
      }
      mid = 0;
      i = Vec_PtrSize(_high);
      while (mid != i + -1) {
        n = mid + i >> 1;
        iVar2 = Abc_FlowRetime_PartialSat(_high,n);
        if (iVar2 == 0) {
          mid = n;
          if (pManMR->fVerbose != 0) {
            printf("-");
          }
        }
        else {
          i = n;
          if (pManMR->fVerbose != 0) {
            printf("*");
          }
        }
        fflush(_stdout);
      }
      iVar2 = Abc_FlowRetime_PartialSat(_high,i);
      if (iVar2 == 0) {
        __assert_fail("Abc_FlowRetime_PartialSat( vNodes, high )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x42b,"void Abc_FlowRetime_ConstrainInit()");
      }
      iVar2 = Abc_FlowRetime_PartialSat(_high,mid);
      if (iVar2 != 0) {
        __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, low )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x42c,"void Abc_FlowRetime_ConstrainInit()");
      }
      pOrigObj = (Abc_Obj_t *)Vec_PtrEntry(_high,mid);
      Abc_NtkMarkCone_rec(pOrigObj,1);
      if (pManMR->fVerbose != 0) {
        printf("   conflict term = %d ",(ulong)(uint)mid);
      }
      Abc_FlowRetime_GetInitToOrig(pOrigObj,(Abc_Obj_t **)&pConstraint,(int *)&pObj);
      if (pConstraint == (InitConstraint_t *)0x0) break;
      if (pManMR->fVerbose != 0) {
        uVar3 = Abc_ObjId((Abc_Obj_t *)pConstraint);
        printf(" <=> %d/%d\n",(ulong)uVar3,(ulong)(uint)pObj);
      }
      uVar3 = Abc_ObjId((Abc_Obj_t *)pConstraint);
      Vec_IntPush((Vec_Int_t *)(__s + 1),uVar3);
      Vec_IntPush((Vec_Int_t *)(__s + 3),(uint)pObj);
      vNodes_00 = _high;
      iVar2 = Vec_PtrSize(_high);
      iVar2 = Abc_FlowRetime_PartialSat(vNodes_00,iVar2);
      if (iVar2 == 0) {
        *__s = 0;
        Vec_PtrPush(pManMR->vInitConstraints,__s);
        for (lag = 0; iVar2 = lag, iVar1 = Vec_PtrSize(pManMR->pInitNtk->vObjs), iVar2 < iVar1;
            lag = lag + 1) {
          pOrigObj = Abc_NtkObj(pManMR->pInitNtk,lag);
          if (pOrigObj != (Abc_Obj_t *)0x0) {
            *(uint *)&pOrigObj->field_0x14 = *(uint *)&pOrigObj->field_0x14 & 0xffffffef;
          }
        }
        Vec_PtrFree(_high);
        return;
      }
    }
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x43e,"void Abc_FlowRetime_ConstrainInit()");
  }
  __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, 0 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                ,0x414,"void Abc_FlowRetime_ConstrainInit()");
}

Assistant:

void Abc_FlowRetime_ConstrainInit( ) {
  Vec_Ptr_t *vNodes;
  int low, high, mid;
  int i, n, lag;
  Abc_Obj_t *pObj = NULL, *pOrigObj;
  InitConstraint_t *pConstraint = ABC_ALLOC( InitConstraint_t, 1 );

  memset( pConstraint, 0, sizeof(InitConstraint_t) );

  assert(pManMR->pInitNtk);

  vprintf("\tsearch for initial state conflict...\n");

  vNodes = Abc_NtkDfs(pManMR->pInitNtk, 0);
  n = Vec_PtrSize(vNodes);
  // also add PIs to vNodes
  Abc_NtkForEachPi(pManMR->pInitNtk, pObj, i) 
    Vec_PtrPush(vNodes, pObj);
  Vec_PtrReorder(vNodes, n);

#if defined(DEBUG_CHECK)
    assert(!Abc_FlowRetime_PartialSat( vNodes, 0 ));
#endif

  // grow initialization constraint
  do {
    vprintf("\t\t");

    // find element to add to set...
    low = 0, high = Vec_PtrSize(vNodes);
    while (low != high-1) {
      mid = (low + high) >> 1;
      
      if (!Abc_FlowRetime_PartialSat( vNodes, mid )) {
        low = mid;
        vprintf("-");
      } else {
        high = mid;
        vprintf("*");
      }
      fflush(stdout);
    }
      
#if defined(DEBUG_CHECK)
    assert(Abc_FlowRetime_PartialSat( vNodes, high ));
    assert(!Abc_FlowRetime_PartialSat( vNodes, low ));
#endif
    
    // mark its TFO
    pObj = (Abc_Obj_t*)Vec_PtrEntry( vNodes, low );
    Abc_NtkMarkCone_rec( pObj, 1 );
    vprintf("   conflict term = %d ", low);

#if 0
    printf("init ------\n");
    Abc_ObjPrint(stdout, pObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pObj, 1 );
    printf("------\n");
#endif

    // add node to constraint
    Abc_FlowRetime_GetInitToOrig( pObj, &pOrigObj, &lag );
    assert(pOrigObj);
    vprintf(" <=> %d/%d\n", Abc_ObjId(pOrigObj), lag);

#if 0    
    printf("orig ------\n");
    Abc_ObjPrint(stdout, pOrigObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pOrigObj, 1 );
    printf("------\n");
#endif
    Vec_IntPush( &pConstraint->vNodes, Abc_ObjId(pOrigObj) );
    Vec_IntPush( &pConstraint->vLags, lag );

  } while (Abc_FlowRetime_PartialSat( vNodes, Vec_PtrSize(vNodes) ));

  pConstraint->pBiasNode = NULL;

  // add constraint
  Vec_PtrPush( pManMR->vInitConstraints, pConstraint );

  // clear marks
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i)
    pObj->fMarkA = 0;

  // free
  Vec_PtrFree( vNodes );
}